

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator::GenerateParsingCode
          (RepeatedImmutableEnumFieldGenerator *this,Printer *printer)

{
  char *text;
  
  text = 
  "int rawValue = input.readEnum();\n@SuppressWarnings(\"deprecation\")\n$type$ value = $type$.$for_number$(rawValue);\nif (value == null) {\n  unknownFields.mergeVarintField($number$, rawValue);\n} else {\n  if (!$get_mutable_bit_parser$) {\n    $name$_ = new java.util.ArrayList<java.lang.Integer>();\n    $set_mutable_bit_parser$;\n  }\n  $name$_.add(rawValue);\n}\n"
  ;
  if (*(char *)(*(long *)(this->descriptor_ + 0x10) + 0x3a) == '\x03') {
    text = 
    "int rawValue = input.readEnum();\nif (!$get_mutable_bit_parser$) {\n  $name$_ = new java.util.ArrayList<java.lang.Integer>();\n  $set_mutable_bit_parser$;\n}\n$name$_.add(rawValue);\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void RepeatedImmutableEnumFieldGenerator::GenerateParsingCode(
    io::Printer* printer) const {
  // Read and store the enum
  if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(variables_,
                   "int rawValue = input.readEnum();\n"
                   "if (!$get_mutable_bit_parser$) {\n"
                   "  $name$_ = new java.util.ArrayList<java.lang.Integer>();\n"
                   "  $set_mutable_bit_parser$;\n"
                   "}\n"
                   "$name$_.add(rawValue);\n");
  } else {
    printer->Print(
        variables_,
        "int rawValue = input.readEnum();\n"
        "@SuppressWarnings(\"deprecation\")\n"
        "$type$ value = $type$.$for_number$(rawValue);\n"
        "if (value == null) {\n"
        "  unknownFields.mergeVarintField($number$, rawValue);\n"
        "} else {\n"
        "  if (!$get_mutable_bit_parser$) {\n"
        "    $name$_ = new java.util.ArrayList<java.lang.Integer>();\n"
        "    $set_mutable_bit_parser$;\n"
        "  }\n"
        "  $name$_.add(rawValue);\n"
        "}\n");
  }
}